

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<float,_2> __thiscall tcu::normalize<float,2>(tcu *this,Vector<float,_2> *a)

{
  Vector<float,_2> VVar1;
  int i;
  long lVar2;
  float fVar3;
  float extraout_XMM0_Db;
  float fVar4;
  float fVar5;
  
  fVar3 = length<float,2>(a);
  fVar5 = 1.0 / fVar3;
  *(undefined8 *)this = 0;
  fVar4 = extraout_XMM0_Db;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    fVar4 = 0.0;
    fVar3 = a->m_data[lVar2] * fVar5;
    *(float *)(this + lVar2 * 4) = fVar3;
  }
  VVar1.m_data[1] = fVar4;
  VVar1.m_data[0] = fVar3;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}